

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

void __thiscall
wasm::SimplifyLocals<false,_true,_true>::checkInvalidations
          (SimplifyLocals<false,_true,_true> *this,EffectAnalyzer *effects)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  pointer puVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>_>
  pVar6;
  uint local_4c;
  pointer puStack_48;
  uint index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> invalidated;
  
  puStack_48 = (pointer)0x0;
  invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  p_Var4 = (this->sinkables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->sinkables)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      bVar3 = EffectAnalyzer::invalidates(effects,(EffectAnalyzer *)&p_Var4[1]._M_left);
      if (bVar3) {
        if (invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&stack0xffffffffffffffb8,
                     (iterator)
                     invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,&p_Var4[1]._M_color);
        }
        else {
          *invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = p_Var4[1]._M_color;
          invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      puVar2 = invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    if (puStack_48 !=
        invalidated.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start) {
      puVar5 = puStack_48;
      do {
        local_4c = *puVar5;
        pVar6 = std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>_>
                ::equal_range(&(this->sinkables)._M_t,&local_4c);
        std::
        _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>_>
        ::_M_erase_aux(&(this->sinkables)._M_t,(_Base_ptr)pVar6.first._M_node,
                       (_Base_ptr)pVar6.second._M_node);
        puVar5 = puVar5 + 1;
      } while (puVar5 != puVar2);
    }
    if (puStack_48 != (pointer)0x0) {
      operator_delete(puStack_48,
                      (long)invalidated.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puStack_48);
    }
  }
  return;
}

Assistant:

void checkInvalidations(EffectAnalyzer& effects) {
    // TODO: this is O(bad)
    std::vector<Index> invalidated;
    for (auto& [index, info] : sinkables) {
      if (effects.invalidates(info.effects)) {
        invalidated.push_back(index);
      }
    }
    for (auto index : invalidated) {
      sinkables.erase(index);
    }
  }